

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_pass(REF_GRID ref_grid)

{
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GRID ref_grid_local;
  
  ref_grid_local._4_4_ = ref_cavity_swap_tet_pass(ref_grid);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_cavity_surf_geom_edge_pass(ref_grid);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_cavity_surf_geom_face_pass(ref_grid);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0xb02,"ref_cavity_pass",(ulong)ref_grid_local._4_4_,"cavity geom edge");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0xb01,"ref_cavity_pass",(ulong)ref_grid_local._4_4_,"cavity geom edge");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0xb00,
           "ref_cavity_pass",(ulong)ref_grid_local._4_4_,"cavity swap pass");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_pass(REF_GRID ref_grid) {
  RSS(ref_cavity_swap_tet_pass(ref_grid), "cavity swap pass");
  RSS(ref_cavity_surf_geom_edge_pass(ref_grid), "cavity geom edge");
  RSS(ref_cavity_surf_geom_face_pass(ref_grid), "cavity geom edge");
  return REF_SUCCESS;
}